

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O1

StrHash hash_sparse_sse42(uint64_t seed,char *str,MSize len)

{
  byte bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (len - 0x80 < 0xffffff84) {
    bVar1 = str[len >> 1];
    uVar7 = ((uint)seed ^ len ^ (uint)(byte)str[(ulong)len - 1] ^ (uint)bVar1) +
            (uint)bVar1 * -0x4000;
    uVar4 = ((byte)*str ^ uVar7) - (uVar7 * 0x800 | uVar7 >> 0x15);
    uVar4 = (bVar1 ^ uVar4) - (uVar4 * 0x2000000 | uVar4 >> 7);
    return (uVar7 ^ uVar4) - (uVar4 * 0x10000 | uVar4 >> 0x10);
  }
  if (0xf < len) {
    uVar2 = hash_16_128(seed,str,len);
    return uVar2;
  }
  if (len < 8) {
    uVar5 = (ulong)*(uint *)str;
    uVar6 = (ulong)*(uint *)(str + ((ulong)len - 4));
  }
  else {
    uVar5 = *(ulong *)str;
    uVar6 = *(ulong *)(str + ((ulong)len - 8));
  }
  uVar4 = crc32(0,(uint)seed ^ len);
  uVar3 = crc32((ulong)uVar4,uVar5);
  uVar3 = crc32(uVar3,uVar6);
  return (StrHash)uVar3;
}

Assistant:

static StrHash hash_sparse_sse42(uint64_t seed, const char* str, MSize len)
{
  if (len < 4 || len >= 128)
    return hash_sparse_1_4(seed, str, len);

  if (len >= 16) /* [16, 128) */
    return hash_16_128(seed, str, len);

  /* [4, 16) */
  return hash_sparse_4_16(seed, str, len);
}